

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O1

vector<candidate_variant,_std::allocator<candidate_variant>_> *
find_variants(vector<candidate_variant,_std::allocator<candidate_variant>_> *__return_storage_ptr__,
             vector<t_GSA,_std::allocator<t_GSA>_> *gsa_cluster)

{
  pointer puVar1;
  uchar uVar2;
  uchar uVar3;
  uint uVar4;
  bool bVar5;
  uint64_t uVar6;
  pointer puVar7;
  pointer puVar8;
  pointer pvVar9;
  uchar uVar10;
  int iVar11;
  uchar *puVar12;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var13;
  pointer paVar14;
  ulong uVar15;
  long lVar16;
  uchar *puVar17;
  ulong uVar18;
  int c;
  ulong uVar19;
  ulong uVar20;
  pointer puVar21;
  vector<t_GSA,_std::allocator<t_GSA>_> *pvVar22;
  byte bVar23;
  ulong uVar24;
  size_t sVar25;
  vector<unsigned_char,_std::allocator<unsigned_char>_> all_chars;
  vector<unsigned_char,_std::allocator<unsigned_char>_> frequent_char_0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> frequent_char_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_idx_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_idx_0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_pos_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> left_pos_0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  counts;
  uchar *local_1d0;
  uchar *local_1c8;
  uchar *puStack_1c0;
  uchar *local_1b8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  vector<t_GSA,_std::allocator<t_GSA>_> *local_190;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  uchar *local_130;
  vector<candidate_variant,_std::allocator<candidate_variant>_> *local_128;
  ulong local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_118;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  ulong local_e0;
  candidate_variant local_d8;
  ulong local_60;
  uchar *local_58;
  uchar *local_50;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<candidate_variant,_std::allocator<candidate_variant>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = __return_storage_ptr__;
  local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
  local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_start + 2;
  *local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start[1] = 0;
  local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_48,2,(value_type *)&local_d8,(allocator_type *)&local_1a8);
  if (local_d8.left_context_idx_0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.left_context_idx_0.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  paVar14 = (gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_190 = gsa_cluster;
  if ((gsa_cluster->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
      super__Vector_impl_data._M_finish == paVar14) {
    uVar18 = 0;
    uVar20 = 0;
    uVar24 = 0;
  }
  else {
    lVar16 = 0xc;
    uVar20 = 0;
    local_120 = 0;
    uVar18 = 0;
    uVar19 = 0;
    do {
      pvVar9 = local_48.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (ulong)*(uint *)((long)paVar14 + lVar16 + -0xc);
      uVar24 = (ulong)*(uint *)((long)paVar14 + lVar16 + -4);
      if (uVar20 < uVar24) {
        local_120 = uVar15;
        uVar18 = (ulong)*(uint *)((long)paVar14 + lVar16 + -8);
      }
      if (uVar24 < uVar20) {
        uVar24 = uVar20;
      }
      uVar20 = uVar24;
      bVar5 = nr_reads1 <= uVar15;
      iVar11 = base_to_int(*(uchar *)((long)&paVar14->text + lVar16));
      puVar1 = pvVar9[bVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start + iVar11;
      *puVar1 = *puVar1 + 1;
      uVar19 = uVar19 + 1;
      paVar14 = (local_190->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x10;
      uVar24 = local_120;
    } while (uVar19 < (ulong)((long)(local_190->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)paVar14 >> 4))
    ;
  }
  if ((ulong)(long)k_right <= uVar20) {
    local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    bVar23 = 0;
    local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    uVar20 = 0;
    local_120 = uVar24;
    do {
      if ((uint)mcov_out <=
          ((local_48.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar20]) {
        uVar10 = (uchar)(0x54474341 >> (bVar23 & 0x1f));
        if (3 < uVar20) {
          uVar10 = 'A';
        }
        local_d8.left_context_idx_0.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_d8.left_context_idx_0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,uVar10);
        if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    (&local_1a8,
                     (iterator)
                     local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_d8);
        }
        else {
          *local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar10;
          local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((uint)mcov_out <=
          local_48.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar20]) {
        uVar10 = (uchar)(0x54474341 >> (bVar23 & 0x1f));
        if (3 < uVar20) {
          uVar10 = 'A';
        }
        local_d8.left_context_idx_0.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(local_d8.left_context_idx_0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,uVar10);
        if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>
                    (&local_188,
                     (iterator)
                     local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_d8);
        }
        else {
          *local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish = uVar10;
          local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      puVar8 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar7 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar20 = uVar20 + 1;
      bVar23 = bVar23 + 8;
    } while (uVar20 != 4);
    if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar16 = 0x3f;
      if ((long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        for (; (ulong)((long)local_1a8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> lVar16 == 0;
            lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar7,puVar8);
    }
    puVar8 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar7 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar16 = 0x3f;
      if ((long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        for (; (ulong)((long)local_188.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_188.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> lVar16 == 0;
            lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar7,puVar8);
    }
    pvVar22 = local_190;
    local_1c8 = (uchar *)0x0;
    puStack_1c0 = (uchar *)0x0;
    local_1b8 = (uchar *)0x0;
    uVar24 = (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (uVar24 == 0) {
      puVar12 = (uchar *)0x0;
    }
    else {
      if ((long)uVar24 < 0) {
        std::__throw_bad_alloc();
      }
      puVar12 = (uchar *)operator_new(uVar24);
    }
    local_1b8 = puVar12 + uVar24;
    sVar25 = (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_1c8 = puVar12;
    if (sVar25 != 0) {
      puStack_1c0 = puVar12;
      memmove(puVar12,local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,sVar25);
    }
    puStack_1c0 = puVar12 + sVar25;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1c8,puVar12,
               local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    puVar17 = puStack_1c0;
    puVar12 = local_1c8;
    if (local_1c8 != puStack_1c0) {
      lVar16 = 0x3f;
      if ((long)puStack_1c0 - (long)local_1c8 != 0) {
        for (; (ulong)((long)puStack_1c0 - (long)local_1c8) >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_1c8,puStack_1c0,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar12,puVar17);
    }
    _Var13 = std::
             __unique<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (local_1c8,puStack_1c0);
    puVar7 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((_Var13._M_current != puStack_1c0) && (puStack_1c0 != _Var13._M_current)) {
      puStack_1c0 = _Var13._M_current;
    }
    local_130 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_1d0 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    sVar25 = (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if ((((((sVar25 != 0) && (sVar25 < 3)) &&
          (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start)) &&
         ((ulong)((long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) < 3)) &&
        ((sVar25 != (long)local_188.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_188.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start ||
         ((local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start &&
          (iVar11 = bcmp(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,sVar25), iVar11 != 0)))))) &&
       (puVar7 != local_130 && (ulong)((long)puStack_1c0 - (long)local_1c8) < 4)) {
      do {
        local_60 = uVar18;
        if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar10 = *local_1d0;
          local_58 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          puVar17 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar12 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          do {
            uVar2 = *puVar17;
            if (uVar10 != uVar2) {
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
              local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (unsigned_long *)0x0;
              local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
              local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
              local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (unsigned_long *)0x0;
              local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
              paVar14 = (pvVar22->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              local_50 = puVar17;
              if ((pvVar22->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                  super__Vector_impl_data._M_finish != paVar14) {
                lVar16 = 0xc;
                uVar18 = 0;
                do {
                  uVar6 = nr_reads1;
                  puVar21 = (pointer)(ulong)*(uint *)((long)paVar14 + lVar16 + -0xc);
                  uVar4 = *(uint *)((long)paVar14 + lVar16 + -8);
                  local_e0 = (ulong)*(uint *)((long)paVar14 + lVar16 + -4);
                  uVar3 = *(uchar *)((long)&paVar14->text + lVar16);
                  if ((((ulong)(long)k_left <= (ulong)uVar4) && (uVar3 == uVar10)) &&
                     ((puVar21 < nr_reads1 &&
                      (((ulong)(long)k_right <= local_e0 &&
                       ((ulong)((long)local_148.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_148.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) <
                        (ulong)(long)consensus_reads)))))) {
                    if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      local_d8.left_context_idx_0.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start = puVar21;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>
                                (&local_148,
                                 (iterator)
                                 local_148.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_d8);
                    }
                    else {
                      *local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)puVar21;
                      local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_148.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                    local_d8.left_context_idx_0.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)(ulong)(uVar4 - k_left);
                    if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>
                                (&local_f8,
                                 (iterator)
                                 local_f8.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_d8);
                    }
                    else {
                      *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           (unsigned_long)
                           local_d8.left_context_idx_0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_f8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  if (((((ulong)(long)k_left <= (ulong)uVar4) && (uVar3 == uVar2)) &&
                      (uVar6 <= puVar21)) &&
                     (((ulong)(long)k_right <= local_e0 &&
                      ((ulong)((long)local_168.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_168.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) <
                       (ulong)(long)consensus_reads)))) {
                    if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      local_d8.left_context_idx_0.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start = puVar21;
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>
                                (&local_168,
                                 (iterator)
                                 local_168.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_d8);
                    }
                    else {
                      *local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish = (unsigned_long)puVar21;
                      local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_168.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                    local_d8.left_context_idx_0.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)(ulong)(uVar4 - k_left);
                    if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>
                                (&local_118,
                                 (iterator)
                                 local_118.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,
                                 (unsigned_long *)&local_d8);
                    }
                    else {
                      *local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           (unsigned_long)
                           local_d8.left_context_idx_0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
                      local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_118.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish + 1;
                    }
                  }
                  uVar18 = uVar18 + 1;
                  paVar14 = (local_190->super__Vector_base<t_GSA,_std::allocator<t_GSA>_>)._M_impl.
                            super__Vector_impl_data._M_start;
                  lVar16 = lVar16 + 0x10;
                } while (uVar18 < (ulong)((long)(local_190->
                                                super__Vector_base<t_GSA,_std::allocator<t_GSA>_>).
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)paVar14 >> 4));
              }
              uVar24 = local_60;
              uVar18 = local_120;
              pvVar22 = local_190;
              if ((local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish !=
                   local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start) &&
                 (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start)) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          (&local_d8.left_context_idx_0,&local_148);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          (&local_d8.left_context_pos_0,&local_f8);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          (&local_d8.left_context_idx_1,&local_168);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          (&local_d8.left_context_pos_1,&local_118);
                local_d8.right_context_idx = uVar18;
                local_d8.right_context_pos = uVar24;
                std::vector<candidate_variant,_std::allocator<candidate_variant>_>::
                emplace_back<candidate_variant>(local_128,&local_d8);
                if (local_d8.left_context_pos_1.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.left_context_pos_1.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_d8.left_context_idx_1.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.left_context_idx_1.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_d8.left_context_pos_0.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.left_context_pos_0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if (local_d8.left_context_idx_0.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8.left_context_idx_0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
              }
              if (local_168.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
                operator_delete(local_168.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              puVar17 = local_50;
              if (local_118.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              puVar12 = local_58;
              if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
                operator_delete(local_148.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_f8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
            puVar17 = puVar17 + 1;
          } while (puVar17 != puVar12);
        }
        local_1d0 = local_1d0 + 1;
        uVar18 = local_60;
      } while (local_1d0 != local_130);
    }
    if (local_1c8 != (uchar *)0x0) {
      operator_delete(local_1c8);
    }
    if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_48);
  return local_128;
}

Assistant:

vector<candidate_variant> find_variants(vector<t_GSA> & gsa_cluster){

	vector<candidate_variant>  out;

	auto counts = vector<vector<unsigned int> >(2,vector<unsigned int>(4,0));

	uint64_t max_lcp_val = 0;//value of max LCP in cluster
	uint64_t max_lcp_read_idx = 0;//index of read with max LCP in cluster
	uint64_t max_lcp_read_pos = 0;//position in read where max LCP starts

	for(uint64_t i=0;i<gsa_cluster.size();++i){

		auto e = gsa_cluster[i];

		//find read with max LCP
		if(e.lcp > max_lcp_val){

			max_lcp_val = e.lcp;
			max_lcp_read_idx = e.text;
			max_lcp_read_pos = e.suff;

		}

		bool sample = e.text < nr_reads1 ? 0 : 1;
		counts[sample?1:0][base_to_int(e.bwt)]++;

	}

	//discard cluster if max LCP is less than k_right
	if(max_lcp_val < k_right) return out;

	//compute the lists of frequent characters in indiv 0 and 1
	vector<unsigned char> frequent_char_0;
	vector<unsigned char> frequent_char_1;

	for(int c=0;c<4;++c){

		if(counts[0][c] >= mcov_out) frequent_char_0.push_back(int_to_base(c));
		if(counts[1][c] >= mcov_out) frequent_char_1.push_back(int_to_base(c));

	}

	std::sort(frequent_char_0.begin(), frequent_char_0.end());
	std::sort(frequent_char_1.begin(), frequent_char_1.end());

	//all variations observed in cluster
	auto all_chars = frequent_char_0;
	all_chars.insert(all_chars.begin(), frequent_char_1.begin(), frequent_char_1.end());
	std::sort( all_chars.begin(), all_chars.end() );
	all_chars.erase(std::unique( all_chars.begin(), all_chars.end() ), all_chars.end());

	//filter: remove clusters that cannot reflect a variation
	if(	frequent_char_0.size()==0 or // not covered enough
		frequent_char_1.size()==0 or // not covered enough
		frequent_char_0.size()>2 or // we require at most 2 alleles per individual
		frequent_char_1.size()>2 or // we require  at most 2 alleles per individual
		frequent_char_0 == frequent_char_1 or // same alleles: probably both heterozigous / multiple region (and no variants)
		all_chars.size() > 3	//4 or more distinct frequent characters in the cluster (probably multiple region)
	){

		return out;

	}

	for(auto c0 : frequent_char_0){

		for(auto c1 : frequent_char_1){

			if(c0 != c1){

				//compute max length of left context in indiv. 0 and 1, on the reads whose left
				//contexts end with c0 and c1, respectively.

				vector<uint64_t> left_pos_0;
				vector<uint64_t> left_idx_0;

				vector<uint64_t> left_pos_1;
				vector<uint64_t> left_idx_1;

				for(uint64_t i=0;i<gsa_cluster.size();++i){

					auto e = gsa_cluster[i];
					bool sample = e.text < nr_reads1 ? 0 : 1;
					uint64_t prefix_len = e.suff;
					unsigned char ch = e.bwt;
					uint64_t lcp = e.lcp;

					if(	prefix_len >= k_left and
						ch == c0 and
						sample == 0 and
						lcp >= k_right and //TODO test
						left_idx_0.size()<consensus_reads){

						left_idx_0.push_back(e.text);
						left_pos_0.push_back(e.suff-k_left);

					}

					if(	prefix_len >= k_left and
						ch == c1 and
						sample == 1 and
						lcp >= k_right and //TODO test
						left_idx_1.size()<consensus_reads){

						left_idx_1.push_back(e.text);
						left_pos_1.push_back(e.suff-k_left);

					}

				}

				if(left_idx_0.size()>0 and left_idx_1.size()>0){

					out.push_back(
						{

							left_idx_0, left_pos_0,
							left_idx_1, left_pos_1,
							max_lcp_read_idx, max_lcp_read_pos

						}
					);

				}

			}

		}

	}

	return out;

}